

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_madd64_q(DisasContext_conflict14 *ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1_low,
                 TCGv_i32 arg1_high,TCGv_i32 arg2,TCGv_i32 arg3,uint32_t n)

{
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i64 dest;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i32 ret_02;
  TCGv_i32 ret_03;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  dest = tcg_temp_new_i64(tcg_ctx);
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_concat_i32_i64_tricore(tcg_ctx,dest,arg1_low,arg1_high);
  tcg_gen_ext_i32_i64_tricore(tcg_ctx,ret,arg2);
  tcg_gen_ext_i32_i64_tricore(tcg_ctx,ret_00,arg3);
  tcg_gen_mul_i64_tricore(tcg_ctx,ret,ret,ret_00);
  if (n != 0) {
    tcg_gen_shli_i64_tricore(tcg_ctx,ret,ret,1);
  }
  tcg_gen_add_i64(tcg_ctx,ret_01,dest,ret);
  tcg_gen_xor_i64_tricore(tcg_ctx,ret_00,ret_01,dest);
  tcg_gen_xor_i64_tricore(tcg_ctx,ret,dest,ret);
  tcg_gen_andc_i64_tricore(tcg_ctx,ret_00,ret_00,ret);
  tcg_gen_extrh_i64_i32_tricore(tcg_ctx,tcg_ctx->cpu_PSW_V,ret_00);
  if (n == 1) {
    ret_02 = tcg_temp_new_i32(tcg_ctx);
    ret_03 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_setcondi_i32_tricore(tcg_ctx,TCG_COND_EQ,ret_02,arg2,-0x80000000);
    tcg_gen_setcond_i32_tricore(tcg_ctx,TCG_COND_EQ,ret_03,arg2,arg3);
    tcg_gen_and_i32(tcg_ctx,ret_02,ret_02,ret_03);
    tcg_gen_shli_i32_tricore(tcg_ctx,ret_02,ret_02,0x1f);
    tcg_gen_xor_i32(tcg_ctx,tcg_ctx->cpu_PSW_V,tcg_ctx->cpu_PSW_V,ret_02);
    tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
    tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_03 + (long)tcg_ctx));
  }
  tcg_gen_extr_i64_i32_tricore(tcg_ctx,rl,rh,ret_01);
  tcg_gen_or_i32(tcg_ctx,tcg_ctx->cpu_PSW_SV,tcg_ctx->cpu_PSW_SV,tcg_ctx->cpu_PSW_V);
  tcg_gen_add_i32(tcg_ctx,tcg_ctx->cpu_PSW_AV,rh,rh);
  tcg_gen_xor_i32(tcg_ctx,tcg_ctx->cpu_PSW_AV,rh,tcg_ctx->cpu_PSW_AV);
  tcg_gen_or_i32(tcg_ctx,tcg_ctx->cpu_PSW_SAV,tcg_ctx->cpu_PSW_SAV,tcg_ctx->cpu_PSW_AV);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(dest + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void
gen_madd64_q(DisasContext *ctx, TCGv rl, TCGv rh, TCGv arg1_low, TCGv arg1_high, TCGv arg2,
             TCGv arg3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t4 = tcg_temp_new_i64(tcg_ctx);
    TCGv temp, temp2;

    tcg_gen_concat_i32_i64(tcg_ctx, t1, arg1_low, arg1_high);
    tcg_gen_ext_i32_i64(tcg_ctx, t2, arg2);
    tcg_gen_ext_i32_i64(tcg_ctx, t3, arg3);

    tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
    if (n != 0) {
        tcg_gen_shli_i64(tcg_ctx, t2, t2, 1);
    }
    tcg_gen_add_i64(tcg_ctx, t4, t1, t2);
    /* calc v bit */
    tcg_gen_xor_i64(tcg_ctx, t3, t4, t1);
    tcg_gen_xor_i64(tcg_ctx, t2, t1, t2);
    tcg_gen_andc_i64(tcg_ctx, t3, t3, t2);
    tcg_gen_extrh_i64_i32(tcg_ctx, tcg_ctx->cpu_PSW_V, t3);
    /* We produce an overflow on the host if the mul before was
       (0x80000000 * 0x80000000) << 1). If this is the
       case, we negate the ovf. */
    if (n == 1) {
        temp = tcg_temp_new(tcg_ctx);
        temp2 = tcg_temp_new(tcg_ctx);
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp, arg2, 0x80000000);
        tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, temp2, arg2, arg3);
        tcg_gen_and_tl(tcg_ctx, temp, temp, temp2);
        tcg_gen_shli_tl(tcg_ctx, temp, temp, 31);
        /* negate v bit, if special condition */
        tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, temp);

        tcg_temp_free(tcg_ctx, temp);
        tcg_temp_free(tcg_ctx, temp2);
    }
    /* write back result */
    tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t4);
    /* Calc SV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
    /* Calc AV/SAV bits */
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, rh, rh);
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, rh, tcg_ctx->cpu_PSW_AV);
    /* calc SAV */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_AV);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
    tcg_temp_free_i64(tcg_ctx, t3);
    tcg_temp_free_i64(tcg_ctx, t4);
}